

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O2

int __thiscall
FIWadManager::IdentifyVersion
          (FIWadManager *this,TArray<FString,_FString> *wadfiles,char *iwad,char *zdoom_wad)

{
  FIWADInfo *pFVar1;
  bool bVar2;
  FString FVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *copyStr;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  TArray<WadStuff,_WadStuff> wads;
  TArray<FString,_FString> gog_paths;
  FString custwad;
  TArray<unsigned_long,_unsigned_long> foundwads;
  TArray<FString,_FString> steam_path;
  FString nice;
  
  wads.Array = (WadStuff *)0x0;
  wads.Most = 0;
  wads.Count = 0;
  foundwads.Array = (unsigned_long *)0x0;
  foundwads.Most = 0;
  foundwads.Count = 0;
  copyStr = DArgs::CheckValue(Args,"-iwad");
  custwad.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  TArray<WadStuff,_WadStuff>::Resize(&wads,(this->mIWadNames).Count);
  TArray<unsigned_long,_unsigned_long>::Resize(&foundwads,(this->mIWads).Count);
  memset(foundwads.Array,0,((ulong)foundwads._8_8_ >> 0x20) << 3);
  if (iwad == (char *)0x0 || copyStr != (char *)0x0) {
    if (copyStr == (char *)0x0) goto LAB_004367bc;
LAB_004367c9:
    FString::operator=(&custwad,copyStr);
    FixPathSeperator(&custwad);
    iVar5 = CheckIWAD(this,custwad.Chars,wads.Array);
    bVar2 = true;
    if (iVar5 == 0) {
      DefaultExtension(&custwad,".wad");
      FVar3 = custwad;
      FString::operator=((this->mIWadNames).Array,&custwad);
      CheckIWAD(this,(char *)"",wads.Array);
      if (FVar3.Chars != (char *)0x0) {
        if (*(int *)(((wads.Array)->Path).Chars + -0xc) == 0) {
          bVar2 = false;
        }
        else {
          bVar2 = false;
          bVar4 = false;
          if (*(int *)((this->mIWads).Array[(wads.Array)->Type].Required.Chars + -0xc) == 0)
          goto LAB_00436912;
        }
      }
    }
  }
  else {
    copyStr = iwad;
    if (*iwad != '\0') goto LAB_004367c9;
LAB_004367bc:
    bVar2 = true;
  }
  bVar4 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,"IWADSearch.Directories",false);
  if (bVar4) {
    while (bVar4 = FConfigFile::NextInSection
                             (&GameConfig->super_FConfigFile,(char **)&gog_paths,
                              (char **)&steam_path), bVar4) {
      iVar5 = strcasecmp((char *)gog_paths.Array,"Path");
      if (iVar5 == 0) {
        NicePath((char *)&nice);
        FixPathSeperator(&nice);
        CheckIWAD(this,nice.Chars,wads.Array);
        FString::~FString(&nice);
      }
    }
  }
  I_GetGogPaths();
  for (uVar8 = 0; uVar8 < gog_paths.Count; uVar8 = uVar8 + 1) {
    CheckIWAD(this,gog_paths.Array[uVar8].Chars,wads.Array);
  }
  I_GetSteamPath();
  for (uVar8 = 0; uVar8 < steam_path.Count; uVar8 = uVar8 + 1) {
    CheckIWAD(this,steam_path.Array[uVar8].Chars,wads.Array);
  }
  TArray<FString,_FString>::~TArray(&steam_path);
  TArray<FString,_FString>::~TArray(&gog_paths);
  bVar4 = true;
  if (!bVar2) {
    bVar4 = *(int *)(((wads.Array)->Path).Chars + -0xc) == 0;
  }
LAB_00436912:
  lVar9 = 0;
  uVar8 = 0;
  for (uVar12 = 0; uVar12 < (this->mIWadNames).Count; uVar12 = uVar12 + 1) {
    uVar10 = uVar8;
    if (*(int *)(*(long *)((long)&((wads.Array)->Path).Chars + lVar9) + -0xc) != 0) {
      if (uVar12 != uVar8) {
        WadStuff::operator=(wads.Array + uVar8,
                            (WadStuff *)((long)&((wads.Array)->Path).Chars + lVar9));
      }
      uVar10 = uVar8 + 1;
      foundwads.Array[wads.Array[uVar8].Type] = uVar10;
    }
    lVar9 = lVar9 + 0x18;
    uVar8 = uVar10;
  }
  for (uVar12 = 0; uVar10 = (ulong)(this->mIWads).Count, uVar12 < uVar10; uVar12 = uVar12 + 1) {
    if ((*(int *)((this->mIWads).Array[uVar12].Required.Chars + -0xc) != 0) &&
       (foundwads.Array[uVar12] != 0)) {
      lVar9 = 0;
      for (uVar11 = 0; uVar11 < uVar10; uVar11 = uVar11 + 1) {
        pFVar1 = (this->mIWads).Array;
        iVar5 = FString::Compare(&pFVar1[uVar12].Required,
                                 (FString *)((long)&(pFVar1->Name).Chars + lVar9));
        if (iVar5 == 0) {
          if (foundwads.Array[uVar11] != 0) {
            (this->mIWads).Array[uVar12].preload = (int)uVar11;
            goto LAB_00436a48;
          }
          break;
        }
        uVar10 = (ulong)(this->mIWads).Count;
        lVar9 = lVar9 + 0x60;
      }
      uVar10 = foundwads.Array[uVar12];
      lVar9 = uVar10 * 0x18;
      for (uVar11 = uVar10; uVar11 < uVar8; uVar11 = uVar11 + 1) {
        WadStuff::operator=((WadStuff *)((long)&wads.Array[-1].Path.Chars + lVar9),
                            (WadStuff *)((long)&((wads.Array)->Path).Chars + lVar9));
        lVar9 = lVar9 + 0x18;
      }
      foundwads.Array[uVar12] = 0;
      for (uVar11 = 0; (ulong)foundwads._8_8_ >> 0x20 != uVar11; uVar11 = uVar11 + 1) {
        if (uVar10 < foundwads.Array[uVar11]) {
          foundwads.Array[uVar11] = foundwads.Array[uVar11] - 1;
        }
      }
      uVar8 = uVar8 - 1;
    }
LAB_00436a48:
  }
  if (uVar8 == 0) {
    uVar12 = 0;
    I_FatalError(
                "Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\nDid you install GZDoom properly? You can do either of the following:\n\n1. Place one or more of these wads in ~/.config/gzdoom/.\n2. Edit your ~/.config/gzdoom/gzdoom.ini and add the directories of your\niwads to the list beneath [IWADSearch.Directories]"
                );
  }
  else {
    uVar12 = 0;
    if ((bool)(bVar4 & uVar8 != 1)) {
      if (*defaultiwad.Value != '\0') {
        lVar9 = 0;
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          ExtractFileBase((char *)&gog_paths,
                          SUB81(*(undefined8 *)((long)&((wads.Array)->Path).Chars + lVar9),0));
          iVar5 = strcasecmp((char *)gog_paths.Array,defaultiwad.Value);
          FString::~FString((FString *)&gog_paths);
          if (iVar5 == 0) goto LAB_00436b5b;
          lVar9 = lVar9 + 0x18;
        }
        uVar12 = 0;
      }
LAB_00436b5b:
      if (havepicked == '\0') {
        uVar6 = I_PickIWad(wads.Array,(int)uVar8,queryiwad.Value,(int)uVar12);
        if ((int)uVar6 < 0) {
          exit(0);
        }
        uVar12 = (ulong)uVar6;
        ExtractFileBase((char *)&gog_paths,SUB81(wads.Array[uVar12].Path.Chars,0));
        FStringCVar::operator=(&defaultiwad,(char *)gog_paths.Array);
        FString::~FString((FString *)&gog_paths);
        havepicked = '\x01';
      }
      else {
        uVar12 = 0;
      }
    }
  }
  TArray<FString,_FString>::Clear(wadfiles);
  D_AddFile(wadfiles,zdoom_wad,true,-1);
  lVar9 = (long)(this->mIWads).Array[wads.Array[uVar12].Type].preload;
  if (-1 < lVar9) {
    D_AddFile(wadfiles,wads.Array[foundwads.Array[lVar9] - 1].Path.Chars,true,-1);
  }
  D_AddFile(wadfiles,wads.Array[uVar12].Path.Chars,true,-1);
  lVar9 = 0;
  for (uVar8 = 0; iVar5 = wads.Array[uVar12].Type, uVar8 < (this->mIWads).Array[iVar5].Load.Count;
      uVar8 = uVar8 + 1) {
    lVar7 = FString::LastIndexOf(&wads.Array[uVar12].Path,'/');
    gog_paths.Array = (FString *)FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    if (lVar7 == -1) {
      FString::operator=((FString *)&gog_paths,(char *)"");
    }
    else {
      FString::FString((FString *)&steam_path,wads.Array[uVar12].Path.Chars,lVar7 + 1);
      FString::operator=((FString *)&gog_paths,(FString *)&steam_path);
      FString::~FString((FString *)&steam_path);
    }
    FString::operator+=((FString *)&gog_paths,
                        (FString *)
                        ((long)&((this->mIWads).Array[wads.Array[uVar12].Type].Load.Array)->Chars +
                        lVar9));
    D_AddFile(wadfiles,(char *)gog_paths.Array,true,-1);
    FString::~FString((FString *)&gog_paths);
    lVar9 = lVar9 + 8;
  }
  FString::~FString(&custwad);
  TArray<unsigned_long,_unsigned_long>::~TArray(&foundwads);
  TArray<WadStuff,_WadStuff>::~TArray(&wads);
  return iVar5;
}

Assistant:

int FIWadManager::IdentifyVersion (TArray<FString> &wadfiles, const char *iwad, const char *zdoom_wad)
{
	TArray<WadStuff> wads;
	TArray<size_t> foundwads;
	const char *iwadparm = Args->CheckValue ("-iwad");
	int pickwad;
	size_t numwads;
	size_t i;
	bool iwadparmfound = false;
	FString custwad;

	wads.Resize(mIWadNames.Size());
	foundwads.Resize(mIWads.Size());
	memset(&foundwads[0], 0, foundwads.Size() * sizeof(foundwads[0]));

	if (iwadparm == NULL && iwad != NULL && *iwad != 0)
	{
		iwadparm = iwad;
	}

	if (iwadparm)
	{
		custwad = iwadparm;
		FixPathSeperator (custwad);
		if (CheckIWAD (custwad, &wads[0]))
		{ // -iwad parameter was a directory
			iwadparm = NULL;
		}
		else
		{
			DefaultExtension (custwad, ".wad");
			iwadparm = custwad;
			mIWadNames[0] = custwad;
			CheckIWAD ("", &wads[0]);
		}
	}

	if (iwadparm == NULL || wads[0].Path.IsEmpty() || mIWads[wads[0].Type].Required.IsNotEmpty())
	{
		if (GameConfig->SetSection ("IWADSearch.Directories"))
		{
			const char *key;
			const char *value;

			while (GameConfig->NextInSection (key, value))
			{
				if (stricmp (key, "Path") == 0)
				{
					FString nice = NicePath(value);
					FixPathSeperator(nice);
					CheckIWAD(nice, &wads[0]);
				}
			}
		}
		TArray<FString> gog_paths = I_GetGogPaths();
		for (i = 0; i < gog_paths.Size(); ++i)
		{
			CheckIWAD (gog_paths[i], &wads[0]);
		}
		TArray<FString> steam_path = I_GetSteamPath();
		for (i = 0; i < steam_path.Size(); ++i)
		{
			CheckIWAD (steam_path[i], &wads[0]);
		}
	}

	if (iwadparm != NULL && !wads[0].Path.IsEmpty())
	{
		iwadparmfound = true;
	}

	for (i = numwads = 0; i < mIWadNames.Size(); i++)
	{
		if (!wads[i].Path.IsEmpty())
		{
			if (i != numwads)
			{
				wads[numwads] = wads[i];
			}
			foundwads[wads[numwads].Type] = numwads + 1;
			numwads++;
		}
	}

	for (unsigned i=0; i<mIWads.Size(); i++)
	{
		if (mIWads[i].Required.IsNotEmpty() && foundwads[i])
		{
			bool found = false;
			// needs to be loaded with another IWAD (HexenDK)
			for (unsigned j=0; j<mIWads.Size(); j++)
			{
				if (!mIWads[i].Required.Compare(mIWads[j].Name))
				{
					if (foundwads[j])
					{
						found = true;
						mIWads[i].preload = j;
					}
					break;
				}
			}
			// The required WAD is not there so this one can't be used and must be deleted from the list
			if (!found)
			{
				size_t kill = foundwads[i];
				for (size_t j = kill; j < numwads; ++j)
				{
					wads[j - 1] = wads[j];
				}
				numwads--;
				foundwads[i] = 0;
				for (unsigned j = 0; j < foundwads.Size(); ++j)
				{
					if (foundwads[j] > kill)
					{
						foundwads[j]--;
					}
				}

			}
		}
	}

	if (numwads == 0)
	{
		I_FatalError ("Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\n"
					  "Did you install " GAMENAME " properly? You can do either of the following:\n"
					  "\n"
#if defined(_WIN32)
					  "1. Place one or more of these wads in the same directory as " GAMENAME ".\n"
					  "2. Edit your " GAMENAMELOWERCASE "-username.ini and add the directories of your iwads\n"
					  "to the list beneath [IWADSearch.Directories]");
#elif defined(__APPLE__)
					  "1. Place one or more of these wads in ~/Library/Application Support/GZdoom/\n"
					  "2. Edit your ~/Library/Application Support/GZdoom/GZdoom.ini and add the directories\n"
					  "of your iwads to the list beneath [IWADSearch.Directories]");
#else
					  "1. Place one or more of these wads in ~/.config/" GAMENAMELOWERCASE "/.\n"
					  "2. Edit your ~/.config/" GAMENAMELOWERCASE "/" GAMENAMELOWERCASE ".ini and add the directories of your\n"
					  "iwads to the list beneath [IWADSearch.Directories]");
#endif
	}

	pickwad = 0;

	if (!iwadparmfound && numwads > 1)
	{
		int defiwad = 0;

		// Locate the user's prefered IWAD, if it was found.
		if (defaultiwad[0] != '\0')
		{
			for (i = 0; i < numwads; ++i)
			{
				FString basename = ExtractFileBase(wads[i].Path);
				if (stricmp(basename, defaultiwad) == 0)
				{
					defiwad = (int)i;
					break;
				}
			}
		}
		if (!havepicked)	// just use the first IWAD if the restart doesn't have a -iwad parameter. We cannot open the picker in fullscreen mode.
		{
			pickwad = I_PickIWad(&wads[0], (int)numwads, queryiwad, defiwad);
			if (pickwad >= 0)
			{
				// The newly selected IWAD becomes the new default
				FString basename = ExtractFileBase(wads[pickwad].Path);
				defaultiwad = basename;
			}
			if (pickwad < 0)
				exit(0);
			havepicked = true;
		}
	}

	// zdoom.pk3 must always be the first file loaded and the IWAD second.
	wadfiles.Clear();
	D_AddFile (wadfiles, zdoom_wad);

	if (mIWads[wads[pickwad].Type].preload >= 0)
	{
		D_AddFile (wadfiles, wads[foundwads[mIWads[wads[pickwad].Type].preload]-1].Path);
	}
	D_AddFile (wadfiles, wads[pickwad].Path);

	for (unsigned i=0; i < mIWads[wads[pickwad].Type].Load.Size(); i++)
	{
		long lastslash = wads[pickwad].Path.LastIndexOf ('/');
		FString path;

		if (lastslash == -1)
		{
			path = "";//  wads[pickwad].Path;
		}
		else
		{
			path = FString (wads[pickwad].Path.GetChars(), lastslash + 1);
		}
		path += mIWads[wads[pickwad].Type].Load[i];
		D_AddFile (wadfiles, path);

	}
	return wads[pickwad].Type;
}